

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.c
# Opt level: O2

dlep_status dlep_base_proto_print_status(dlep_session *session)

{
  int iVar1;
  dlep_status dVar2;
  dlep_status status;
  char text [256];
  
  iVar1 = dlep_reader_status(&status,text,0x100,session,(dlep_parser_value *)0x0);
  dVar2 = DLEP_STATUS_OKAY;
  if ((iVar1 == 0) && (dVar2 = status, (log_global_mask[session->log_source] & 1) != 0)) {
    oonf_log(LOG_SEVERITY_DEBUG,session->log_source,"src/generic/dlep/ext_base_proto/proto.c",0x1e8,
             (void *)0x0,0,"Status %d received: %s",(ulong)(uint)status,text);
    dVar2 = status;
  }
  return dVar2;
}

Assistant:

enum dlep_status
dlep_base_proto_print_status(struct dlep_session *session)
{
  enum dlep_status status;
  char text[256];

  if (!dlep_reader_status(&status, text, sizeof(text), session, NULL)) {
    OONF_DEBUG(session->log_source, "Status %d received: %s", status, text);

    return status;
  }
  return DLEP_STATUS_OKAY;
}